

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O2

void __thiscall SubprocessTestInterruptChild::Run(SubprocessTestInterruptChild *this)

{
  Test *this_00;
  bool bVar1;
  ExitStatus EVar2;
  Subprocess *this_01;
  SubprocessSet *this_02;
  allocator<char> local_39;
  string local_38;
  
  this_02 = &(this->super_SubprocessTest).subprocs_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"kill -INT $$",&local_39);
  this_01 = SubprocessSet::Add(this_02,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  bVar1 = testing::Test::Check
                    (g_current_test,this_01 != (Subprocess *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
                     ,0x4f,"(Subprocess *) 0 != subproc");
  if (bVar1) {
    while( true ) {
      bVar1 = Subprocess::Done(this_01);
      this_00 = g_current_test;
      if (bVar1) break;
      SubprocessSet::DoWork(this_02);
    }
    EVar2 = Subprocess::Finish(this_01);
    testing::Test::Check
              (this_00,EVar2 == ExitInterrupted,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/subprocess_test.cc"
               ,0x55,"ExitInterrupted == subproc->Finish()");
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(SubprocessTest, InterruptChild) {
  Subprocess* subproc = subprocs_.Add("kill -INT $$");
  ASSERT_NE((Subprocess *) 0, subproc);

  while (!subproc->Done()) {
    subprocs_.DoWork();
  }

  EXPECT_EQ(ExitInterrupted, subproc->Finish());
}